

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

SegmentBuilder * __thiscall
capnp::_::BuilderArena::addSegmentInternal<capnp::word>
          (BuilderArena *this,ArrayPtr<capnp::word> content)

{
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar1;
  Own<capnp::_::SegmentBuilder> *pOVar2;
  Own<capnp::_::SegmentBuilder> *pOVar3;
  MultiSegmentState *this_00;
  SegmentBuilder *pSVar4;
  long lVar5;
  ArrayPtr<const_capnp::word> *pAVar6;
  Exception *pEVar7;
  MultiSegmentState *ptrCopy;
  size_t newSize;
  ulong newSize_00;
  ulong uVar8;
  ArrayPtr<const_capnp::word> *pAVar9;
  SegmentBuilder *ptrCopy_1;
  Fault f;
  Fault local_48;
  word *local_40;
  anon_class_8_1_89918cff local_38;
  
  pEVar7 = (Exception *)content.size_;
  local_40 = content.ptr;
  if ((this->segment0).super_SegmentReader.arena == (Arena *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
               ,0xe6,FAILED,"segment0.getArena() != nullptr",
               "\"Can\'t allocate external segments before allocating the root segment.\"",
               (char (*) [69])
               "Can\'t allocate external segments before allocating the root segment.");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  local_38.size = (size_t *)&local_48;
  local_48.exception = pEVar7;
  if ((Exception *)0x1fffffff < pEVar7) {
    verifySegmentSize::anon_class_8_1_89918cff::operator()(&local_38);
  }
  this_00 = (this->moreSegments).ptr.ptr;
  if (this_00 == (MultiSegmentState *)0x0) {
    this_00 = (MultiSegmentState *)operator_new(0x40);
    (this_00->builders).builder.ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
    (this_00->builders).builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    (this_00->builders).builder.endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
    (this_00->builders).builder.disposer = (ArrayDisposer *)0x0;
    (this_00->forOutput).builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    (this_00->forOutput).builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    (this_00->forOutput).builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    (this_00->forOutput).builder.disposer = (ArrayDisposer *)0x0;
    (this->moreSegments).ptr.disposer =
         (Disposer *)&kj::_::HeapDisposer<capnp::_::BuilderArena::MultiSegmentState>::instance;
    (this->moreSegments).ptr.ptr = this_00;
  }
  pRVar1 = (this_00->builders).builder.pos;
  pOVar2 = (this_00->builders).builder.ptr;
  pSVar4 = (SegmentBuilder *)operator_new(0x38);
  (pSVar4->super_SegmentReader).arena = &this->super_Arena;
  (pSVar4->super_SegmentReader).id.value = (int)((ulong)((long)pRVar1 - (long)pOVar2) >> 4) + 1;
  (pSVar4->super_SegmentReader).ptr.ptr = local_40;
  (pSVar4->super_SegmentReader).ptr.size_ = (size_t)pEVar7;
  (pSVar4->super_SegmentReader).readLimiter = &this->dummyLimiter;
  pSVar4->pos = local_40;
  pSVar4->readOnly = false;
  pOVar2 = (this_00->builders).builder.endPtr;
  if ((this_00->builders).builder.pos == pOVar2) {
    pOVar3 = (this_00->builders).builder.ptr;
    newSize = 4;
    if (pOVar2 != pOVar3) {
      newSize = (long)pOVar2 - (long)pOVar3 >> 3;
    }
    kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::setCapacity(&this_00->builders,newSize);
  }
  pRVar1 = (this_00->builders).builder.pos;
  pRVar1->disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentBuilder>::instance;
  pRVar1->ptr = pSVar4;
  (this_00->builders).builder.pos = pRVar1 + 1;
  uVar8 = ((long)(pRVar1 + 1) - (long)(this_00->builders).builder.ptr >> 4) + 1;
  pAVar6 = (this_00->forOutput).builder.ptr;
  pAVar9 = (this_00->forOutput).builder.endPtr;
  lVar5 = (long)pAVar9 - (long)pAVar6;
  if ((ulong)(lVar5 >> 4) < uVar8) {
    newSize_00 = 4;
    if (pAVar9 != pAVar6) {
      newSize_00 = lVar5 >> 3;
    }
    if (newSize_00 < uVar8) {
      newSize_00 = uVar8;
    }
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::setCapacity(&this_00->forOutput,newSize_00);
  }
  pAVar9 = (this_00->forOutput).builder.ptr + uVar8;
  pAVar6 = (this_00->forOutput).builder.pos;
  if (pAVar6 < pAVar9) {
    do {
      (this_00->forOutput).builder.pos = pAVar6 + 1;
      pAVar6->ptr = (word *)0x0;
      pAVar6->size_ = 0;
      pAVar6 = (this_00->forOutput).builder.pos;
    } while (pAVar6 < pAVar9);
  }
  else {
    (this_00->forOutput).builder.pos = pAVar9;
  }
  return pSVar4;
}

Assistant:

SegmentBuilder* BuilderArena::addSegmentInternal(kj::ArrayPtr<T> content) {
  // This check should never fail in practice, since you can't get an Orphanage without allocating
  // the root segment.
  KJ_REQUIRE(segment0.getArena() != nullptr,
      "Can't allocate external segments before allocating the root segment.");

  auto contentSize = verifySegmentSize(content.size());

  MultiSegmentState* segmentState;
  KJ_IF_MAYBE(s, moreSegments) {
    segmentState = *s;
  } else {
    auto newSegmentState = kj::heap<MultiSegmentState>();
    segmentState = newSegmentState;
    moreSegments = kj::mv(newSegmentState);
  }